

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O3

size_t ver_get_last_wal_flush_hdr_off(filemgr_magic_t magic)

{
  if (magic == 0xdeadcafebeefbeef) {
    return 0x28;
  }
  if (magic != 0xdeadcafebeefc002) {
    if (magic == 0xdeadcafebeefc001) {
      return 0x30;
    }
    return 0xffffffffffffffff;
  }
  return 0x38;
}

Assistant:

size_t ver_get_last_wal_flush_hdr_off(filemgr_magic_t magic) {
    switch(magic) {
        case FILEMGR_MAGIC_000: return 40;
        case FILEMGR_MAGIC_001: return 48;
        case FILEMGR_MAGIC_002: return 56;
    }
    return (size_t) -1;
}